

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase888::run(TestCase888 *this)

{
  PromiseNode *pPVar1;
  long *plVar2;
  undefined8 uVar3;
  Exception *pEVar4;
  Exception *pEVar5;
  ClientHook *pCVar6;
  size_t sVar7;
  __pid_t _Var8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TransformPromiseNodeBase *pTVar9;
  byte bVar10;
  Own<kj::_::PromiseNode> *pOVar11;
  undefined7 uVar13;
  char *pcVar12;
  Own<capnp::ClientHook> OVar14;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface> set1;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface> set2;
  bool resolved3;
  bool resolved2;
  bool resolved1;
  WaitScope waitScope;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:925:13),_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
  promise1;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> paf;
  int callCount;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> errorPaf;
  Client clientPromise;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:935:13),_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
  promise3;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:930:13),_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
  promise2;
  Own<capnp::_::TestInterfaceImpl> ownServer2;
  Own<capnp::_::TestInterfaceImpl> ownServer1;
  Client client1;
  Client errorPromise;
  Client client2;
  Client clientNull;
  Client clientStandalone;
  EventLoop loop;
  undefined1 local_33d;
  undefined1 local_33c [12];
  TransformPromiseNodeBase *local_330;
  WaitScope local_328;
  Own<kj::_::PromiseNode> local_318;
  Fault local_300;
  long *local_2f8;
  undefined8 *local_2f0;
  long *local_2e8;
  int local_2dc;
  Promise<kj::Own<capnp::ClientHook>_> local_2d8;
  undefined8 *local_2c8;
  long *local_2c0;
  Fault local_2b0;
  undefined8 *local_2a8;
  long *local_2a0;
  ExceptionOrValue local_298;
  char local_138;
  Own<kj::_::PromiseNode> local_130;
  Own<kj::_::PromiseNode> local_120;
  Disposer *local_110;
  Exception *local_108;
  Disposer *local_100;
  Exception *local_f8;
  undefined1 local_f0 [8];
  undefined8 *local_e8;
  long *local_e0;
  pointer_____offset_0x10___ *local_d8;
  undefined8 *local_d0;
  long *local_c8;
  undefined1 local_c0 [16];
  long *local_b0;
  pointer_____offset_0x10___ *local_a8;
  Client local_a0;
  pointer_____offset_0x10___ *local_90;
  Client local_88;
  String local_78;
  EventLoop local_60;
  
  kj::EventLoop::EventLoop(&local_60);
  local_328.busyPollInterval = 0xffffffff;
  local_328.loop = &local_60;
  kj::EventLoop::enterScope(&local_60);
  local_2dc = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_300,&local_2dc);
  local_298.exception.ptr._0_8_ = local_300.exception;
  local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)((long)local_2f8 + 0x10);
  if (local_2f8 == (long *)0x0) {
    local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)(Server *)0x0;
  }
  local_2f8 = (long *)0x0;
  OVar14 = Capability::Client::makeLocalClient
                     (&local_88,(Own<capnp::Capability::Server> *)&local_298);
  uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
    local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (**(_func_int **)(((String *)local_298.exception.ptr._0_8_)->content).ptr)
              (local_298.exception.ptr._0_8_,(char *)(uVar3 + *(long *)(*(long *)uVar3 + -0x10)),
               OVar14.ptr);
  }
  local_90 = &Capability::Client::typeinfo;
  if (local_2f8 != (long *)0x0) {
    local_2f8 = (long *)0x0;
    (**(_func_int **)((local_300.exception)->ownFile).content.ptr)();
  }
  Capability::Client::Client(&local_a0,(void *)0x0);
  local_a8 = &Capability::Client::typeinfo;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_100,&local_2dc);
  pEVar5 = local_f8;
  local_298.exception.ptr._0_8_ = local_100;
  local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)local_f8;
  local_f8 = (Exception *)0x0;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::add
            ((Client *)local_f0,
             (CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_33d,
             (Own<capnproto_test::capnp::test::TestInterface::Server> *)&local_298);
  uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
    local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_298.exception.ptr._0_8_)
              (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
  }
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_110,&local_2dc);
  pEVar4 = local_108;
  local_298.exception.ptr._0_8_ = local_110;
  local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)local_108;
  local_108 = (Exception *)0x0;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::add
            ((Client *)local_c0,
             (CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_33c,
             (Own<capnproto_test::capnp::test::TestInterface::Server> *)&local_298);
  uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
    local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_298.exception.ptr._0_8_)
              (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
  }
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
             (Client *)&local_33d);
  _Var8 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                     &local_298,&local_328);
  uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
    local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_298.exception.ptr._0_8_)
              (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
  }
  if ((Exception *)CONCAT44(extraout_var,_Var8) == (Exception *)0x0) {
    local_300.exception = (Exception *)0x0;
    local_298.exception.ptr._0_8_ = (Disposer *)0x0;
    local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    kj::_::Debug::Fault::init
              (&local_300,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_300);
  }
  if ((pEVar5 != (Exception *)CONCAT44(extraout_var,_Var8)) && (kj::_::Debug::minSeverity < 3)) {
    local_300.exception = pEVar5;
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
               (Client *)&local_33d);
    _Var8 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       &local_298,&local_328);
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    local_2d8.super_PromiseBase.node.disposer = (Disposer *)CONCAT44(extraout_var_00,_Var8);
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    if (local_2d8.super_PromiseBase.node.disposer == (Disposer *)0x0) {
      local_2b0.exception = (Exception *)0x0;
      local_298.exception.ptr._0_8_ = (Disposer *)0x0;
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      kj::_::Debug::Fault::init
                (&local_2b0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                );
      kj::_::Debug::Fault::fatal(&local_2b0);
    }
    kj::_::Debug::
    log<char_const(&)[442],capnp::_::TestInterfaceImpl*,capnproto_test::capnp::test::TestInterface::Server*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x38b,ERROR,
               "\"failed: expected \" \"(&server1) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\\\", 907, ::kj::Exception::Type::FAILED, \\\"set1.getLocalServer(client1).wait(waitScope)\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", &server1, &(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 907, ::kj::Exception::Type::FAILED, \"set1.getLocalServer(client1).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [442])
                "failed: expected (&server1) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 907, ::kj::Exception::Type::FAILED, \"set1.getLocalServer(client1).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(TestInterfaceImpl **)&local_300,(Server **)&local_2d8);
  }
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
             (Client *)local_33c);
  _Var8 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                     &local_298,&local_328);
  uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
    local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (***(_func_int ***)local_298.exception.ptr._0_8_)
              (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
  }
  if ((Exception *)CONCAT44(extraout_var_01,_Var8) != (Exception *)0x0) {
    if ((pEVar4 != (Exception *)CONCAT44(extraout_var_01,_Var8)) && (kj::_::Debug::minSeverity < 3))
    {
      local_300.exception = pEVar4;
      CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
                ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
                 (Client *)local_33c);
      _Var8 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                        ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
                          *)&local_298,&local_328);
      uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
      if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
        local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
        (***(_func_int ***)local_298.exception.ptr._0_8_)
                  (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2])
                  );
      }
      if ((Disposer *)CONCAT44(extraout_var_02,_Var8) == (Disposer *)0x0) {
        local_2b0.exception = (Exception *)0x0;
        local_298.exception.ptr._0_8_ = (Disposer *)0x0;
        local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
        kj::_::Debug::Fault::init
                  (&local_2b0,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_2b0);
      }
      local_2d8.super_PromiseBase.node.disposer = (Disposer *)CONCAT44(extraout_var_02,_Var8);
      kj::_::Debug::
      log<char_const(&)[442],capnp::_::TestInterfaceImpl*,capnproto_test::capnp::test::TestInterface::Server*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x38c,ERROR,
                 "\"failed: expected \" \"(&server2) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\\\", 908, ::kj::Exception::Type::FAILED, \\\"set2.getLocalServer(client2).wait(waitScope)\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", &server2, &(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 908, ::kj::Exception::Type::FAILED, \"set2.getLocalServer(client2).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [442])
                  "failed: expected (&server2) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 908, ::kj::Exception::Type::FAILED, \"set2.getLocalServer(client2).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(TestInterfaceImpl **)&local_300,(Server **)&local_2d8);
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
               (Client *)&local_33d);
    _Var8 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       &local_298,&local_328);
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    if ((CONCAT44(extraout_var_03,_Var8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[73]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x38f,ERROR,
                 "\"failed: expected \" \"set1.getLocalServer(client2).wait(waitScope) == nullptr\""
                 ,(char (*) [73])
                  "failed: expected set1.getLocalServer(client2).wait(waitScope) == nullptr");
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
               (Client *)local_33c);
    _Var8 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       &local_298,&local_328);
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    if ((CONCAT44(extraout_var_04,_Var8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[73]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x390,ERROR,
                 "\"failed: expected \" \"set2.getLocalServer(client1).wait(waitScope) == nullptr\""
                 ,(char (*) [73])
                  "failed: expected set2.getLocalServer(client1).wait(waitScope) == nullptr");
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
               (Client *)&local_33d);
    _Var8 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       &local_298,&local_328);
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    if ((CONCAT44(extraout_var_05,_Var8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[82]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x391,ERROR,
                 "\"failed: expected \" \"set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr\""
                 ,(char (*) [82])
                  "failed: expected set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr"
                );
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
               (Client *)&local_33d);
    _Var8 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                      ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                       &local_298,&local_328);
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    if ((CONCAT44(extraout_var_06,_Var8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[76]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x392,ERROR,
                 "\"failed: expected \" \"set1.getLocalServer(clientNull).wait(waitScope) == nullptr\""
                 ,(char (*) [76])
                  "failed: expected set1.getLocalServer(clientNull).wait(waitScope) == nullptr");
    }
    kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestInterface::Client>();
    kj::
    heap<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,capnproto_test::capnp::test::TestInterface::Client,capnp::Capability::Client::Client<capnproto_test::capnp::test::TestInterface::Client,void>(kj::Promise<capnproto_test::capnp::test::TestInterface::Client>&&)::_lambda(capnproto_test::capnp::test::TestInterface::Client&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::Capability::Client::Client<capnproto_test::capnp::test::TestInterface::Client,void>(kj::Promise<capnproto_test::capnp::test::TestInterface::Client>&&)::_lambda(capnproto_test::capnp::test::TestInterface::Client&&)_1_,kj::_::PropagateException>
              ((Own<kj::_::PromiseNode> *)&local_298,(anon_class_1_0_00000001_for_func *)&local_300,
               (PropagateException *)&local_d8);
    local_2d8.super_PromiseBase.node.disposer = (Disposer *)local_298.exception.ptr._0_8_;
    local_2d8.super_PromiseBase.node.ptr =
         (PromiseNode *)local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    OVar14 = newLocalPromiseClient((capnp *)&local_2a8,&local_2d8);
    pPVar1 = local_2d8.super_PromiseBase.node.ptr;
    if ((Server *)local_2d8.super_PromiseBase.node.ptr != (Server *)0x0) {
      local_2d8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_2d8.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_2d8.super_PromiseBase.node.disposer,
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode,OVar14.ptr);
    }
    local_2b0.exception = (Exception *)&Capability::Client::typeinfo;
    kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestInterface::Client>();
    pOVar11 = &local_130;
    kj::
    heap<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,capnproto_test::capnp::test::TestInterface::Client,capnp::Capability::Client::Client<capnproto_test::capnp::test::TestInterface::Client,void>(kj::Promise<capnproto_test::capnp::test::TestInterface::Client>&&)::_lambda(capnproto_test::capnp::test::TestInterface::Client&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::Capability::Client::Client<capnproto_test::capnp::test::TestInterface::Client,void>(kj::Promise<capnproto_test::capnp::test::TestInterface::Client>&&)::_lambda(capnproto_test::capnp::test::TestInterface::Client&&)_1_,kj::_::PropagateException>
              ((Own<kj::_::PromiseNode> *)&local_298,(anon_class_1_0_00000001_for_func *)&local_2d8,
               (PropagateException *)&local_120);
    local_318.disposer = (Disposer *)local_298.exception.ptr._0_8_;
    local_318.ptr = (PromiseNode *)local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    OVar14 = newLocalPromiseClient
                       ((capnp *)&local_d0,(Promise<kj::Own<capnp::ClientHook>_> *)&local_318);
    pPVar1 = local_318.ptr;
    if ((Server *)local_318.ptr != (Server *)0x0) {
      local_318.ptr = (PromiseNode *)0x0;
      (**(local_318.disposer)->_vptr_Disposer)
                (local_318.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode
                 ,OVar14.ptr);
    }
    local_d8 = &Capability::Client::typeinfo;
    local_33c[3] = 0;
    local_33c[2] = 0;
    local_33c[1] = '\0';
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
               (Client *)&local_33d);
    pTVar9 = (TransformPromiseNodeBase *)operator_new(0x38);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(Own<kj::_::PromiseNode> *)&local_298,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:925:13),_kj::_::PropagateException>
               ::anon_class_16_2_d9e2555e_for_func::operator());
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00608d70;
    pTVar9[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)(local_33c + 3);
    pTVar9[1].dependency.disposer = (Disposer *)pEVar5;
    local_318.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_0,kj::_::PropagateException>>
          ::instance;
    local_318.ptr = (PromiseNode *)pTVar9;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
               (Client *)local_33c);
    pTVar9 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(Own<kj::_::PromiseNode> *)&local_298,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:930:13),_kj::_::PropagateException>
               ::anon_class_8_1_9ee849da_for_func::operator());
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00608df8;
    pTVar9[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)(local_33c + 2);
    local_120.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_1,kj::_::PropagateException>>
          ::instance;
    local_120.ptr = (PromiseNode *)pTVar9;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
              ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_298,
               (Client *)&local_33d);
    pTVar9 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(Own<kj::_::PromiseNode> *)&local_298,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:935:13),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:937:6)>
               ::anon_class_1_0_00000001_for_func::operator());
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00608e80;
    pTVar9[1].dependency.disposer = (Disposer *)(local_33c + 1);
    local_130.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>,capnp::_::(anonymous_namespace)::TestCase888::run()::$_2,capnp::_::(anonymous_namespace)::TestCase888::run()::$_3>>
          ::instance;
    local_130.ptr = (PromiseNode *)pTVar9;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    kj::_::yield();
    pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(Own<kj::_::PromiseNode> *)&local_298,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:942:17),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00608f08;
    local_33c._4_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_4,kj::_::PropagateException>>
          ::instance;
    local_330 = pTVar9;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    local_298.exception.ptr._0_8_ = local_298.exception.ptr._0_8_ & 0xffffffffffffff00;
    local_138 = '\0';
    kj::_::waitImpl((Own<kj::_::PromiseNode> *)(local_33c + 4),&local_298,&local_328);
    if (local_138 == '\x01') {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet !=
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
      }
    }
    else {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet ==
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::_::unreachable();
      }
      kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
    }
    if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
        local_298.exception.ptr.isSet ==
        (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x1) {
      kj::Exception::~Exception(&local_298.exception.ptr.field_1.value);
    }
    pTVar9 = local_330;
    if (local_330 != (TransformPromiseNodeBase *)0x0) {
      local_330 = (TransformPromiseNodeBase *)0x0;
      (*(code *)**(undefined8 **)local_33c._4_8_)
                (local_33c._4_8_,
                 (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
    }
    kj::_::yield();
    pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(Own<kj::_::PromiseNode> *)&local_298,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:943:17),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00608f90;
    local_33c._4_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_5,kj::_::PropagateException>>
          ::instance;
    local_330 = pTVar9;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    local_298.exception.ptr._0_8_ = local_298.exception.ptr._0_8_ & 0xffffffffffffff00;
    local_138 = '\0';
    kj::_::waitImpl((Own<kj::_::PromiseNode> *)(local_33c + 4),&local_298,&local_328);
    if (local_138 == '\x01') {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet !=
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
      }
    }
    else {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet ==
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::_::unreachable();
      }
      kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
    }
    if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
        local_298.exception.ptr.isSet ==
        (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x1) {
      kj::Exception::~Exception(&local_298.exception.ptr.field_1.value);
    }
    pTVar9 = local_330;
    if (local_330 != (TransformPromiseNodeBase *)0x0) {
      local_330 = (TransformPromiseNodeBase *)0x0;
      (*(code *)**(undefined8 **)local_33c._4_8_)
                (local_33c._4_8_,
                 (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
    }
    kj::_::yield();
    pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(Own<kj::_::PromiseNode> *)&local_298,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:944:17),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00609018;
    local_33c._4_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_6,kj::_::PropagateException>>
          ::instance;
    local_330 = pTVar9;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    local_298.exception.ptr._0_8_ = local_298.exception.ptr._0_8_ & 0xffffffffffffff00;
    local_138 = '\0';
    kj::_::waitImpl((Own<kj::_::PromiseNode> *)(local_33c + 4),&local_298,&local_328);
    if (local_138 == '\x01') {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet !=
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
      }
    }
    else {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet ==
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::_::unreachable();
      }
      kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
    }
    if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
        local_298.exception.ptr.isSet ==
        (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x1) {
      kj::Exception::~Exception(&local_298.exception.ptr.field_1.value);
    }
    pTVar9 = local_330;
    if (local_330 != (TransformPromiseNodeBase *)0x0) {
      local_330 = (TransformPromiseNodeBase *)0x0;
      (*(code *)**(undefined8 **)local_33c._4_8_)
                (local_33c._4_8_,
                 (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
    }
    kj::_::yield();
    pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar9,(Own<kj::_::PromiseNode> *)&local_298,
               kj::_::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:945:17),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.ptr;
    (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006090a0;
    local_33c._4_8_ =
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase888::run()::$_7,kj::_::PropagateException>>
          ::instance;
    local_330 = pTVar9;
    if ((Server *)local_298.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (***(_func_int ***)local_298.exception.ptr._0_8_)
                (local_298.exception.ptr._0_8_,(char *)(uVar3 + (long)(*(_func_int ***)uVar3)[-2]));
    }
    local_298.exception.ptr._0_8_ = local_298.exception.ptr._0_8_ & 0xffffffffffffff00;
    local_138 = '\0';
    kj::_::waitImpl((Own<kj::_::PromiseNode> *)(local_33c + 4),&local_298,&local_328);
    if (local_138 == '\x01') {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet !=
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
      }
    }
    else {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet ==
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::_::unreachable();
      }
      kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
    }
    if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
        local_298.exception.ptr.isSet ==
        (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x1) {
      kj::Exception::~Exception(&local_298.exception.ptr.field_1.value);
    }
    pTVar9 = local_330;
    if (local_330 != (TransformPromiseNodeBase *)0x0) {
      local_330 = (TransformPromiseNodeBase *)0x0;
      (*(code *)**(undefined8 **)local_33c._4_8_)
                (local_33c._4_8_,
                 (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
    }
    uVar13 = (undefined7)((ulong)pOVar11 >> 8);
    if ((local_33c[3] & kj::_::Debug::minSeverity < 3) != 0) {
      uVar13 = 0x4ab9;
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3b3,ERROR,"\"failed: expected \" \"!(resolved1)\"",
                 (char (*) [30])"failed: expected !(resolved1)");
    }
    bVar10 = kj::_::Debug::minSeverity < 3 & local_33c[2];
    pcVar12 = (char *)CONCAT71(uVar13,bVar10);
    if (bVar10 == 1) {
      pcVar12 = "\"failed: expected \" \"!(resolved2)\"";
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3b4,ERROR,"\"failed: expected \" \"!(resolved2)\"",
                 (char (*) [30])"failed: expected !(resolved2)");
    }
    if ((local_33c[1] == '\x01') && (kj::_::Debug::minSeverity < 3)) {
      pcVar12 = "\"failed: expected \" \"!(resolved3)\"";
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3b5,ERROR,"\"failed: expected \" \"!(resolved3)\"",
                 (char (*) [30])"failed: expected !(resolved3)");
    }
    plVar2 = local_2e8;
    (**(code **)(**(long **)((long)&local_e8 + (long)*(_func_int **)((long)local_f0 + -0x18)) + 0x20
                ))(&local_298.exception.ptr.field_1);
    local_298.exception.ptr._0_8_ = &Capability::Client::typeinfo;
    (**(code **)*plVar2)(plVar2);
    uVar3 = local_298.exception.ptr.field_1.value.ownFile.content.size_;
    if ((long *)local_298.exception.ptr.field_1.value.ownFile.content.size_ != (long *)0x0) {
      local_298.exception.ptr.field_1.value.ownFile.content.size_ = 0;
      (***(_func_int ***)local_298.exception.ptr.field_1.value.ownFile.content.ptr)
                (local_298.exception.ptr.field_1.value.ownFile.content.ptr,
                 uVar3 + *(long *)(*(long *)uVar3 + -0x10));
    }
    plVar2 = local_2c0;
    kj::_::Debug::makeDescription<char_const(&)[4]>
              (&local_78,(Debug *)"\"foo\"","foo",(char (*) [4])pcVar12);
    kj::Exception::Exception
              ((Exception *)&local_298,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3b8,&local_78);
    (**(code **)(*plVar2 + 8))(plVar2,(Exception *)&local_298);
    kj::Exception::~Exception((Exception *)&local_298);
    sVar7 = local_78.content.size_;
    pcVar12 = local_78.content.ptr;
    if (local_78.content.ptr != (char *)0x0) {
      local_78.content.ptr = (char *)0x0;
      local_78.content.size_ = 0;
      (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                (local_78.content.disposer,pcVar12,1,sVar7,sVar7,0);
    }
    local_298.exception.ptr._0_8_ = local_298.exception.ptr._0_8_ & 0xffffffffffffff00;
    local_138 = '\0';
    kj::_::waitImpl(&local_318,&local_298,&local_328);
    if (local_138 == '\x01') {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet !=
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
      }
    }
    else {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet ==
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::_::unreachable();
      }
      kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
    }
    if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
        local_298.exception.ptr.isSet ==
        (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x1) {
      kj::Exception::~Exception(&local_298.exception.ptr.field_1.value);
    }
    local_298.exception.ptr._0_8_ = local_298.exception.ptr._0_8_ & 0xffffffffffffff00;
    local_138 = '\0';
    kj::_::waitImpl(&local_120,&local_298,&local_328);
    if (local_138 == '\x01') {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet !=
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
      }
    }
    else {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet ==
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::_::unreachable();
      }
      kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
    }
    if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
        local_298.exception.ptr.isSet ==
        (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x1) {
      kj::Exception::~Exception(&local_298.exception.ptr.field_1.value);
    }
    local_298.exception.ptr._0_8_ = local_298.exception.ptr._0_8_ & 0xffffffffffffff00;
    local_138 = '\0';
    kj::_::waitImpl(&local_130,&local_298,&local_328);
    if (local_138 == '\x01') {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet !=
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
      }
    }
    else {
      if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
          local_298.exception.ptr.isSet ==
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x0) {
        kj::_::unreachable();
      }
      kj::throwRecoverableException(&local_298.exception.ptr.field_1.value,0);
    }
    if ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)
        local_298.exception.ptr.isSet ==
        (CapabilityServerSet<capnproto_test::capnp::test::TestInterface>)0x1) {
      kj::Exception::~Exception(&local_298.exception.ptr.field_1.value);
    }
    if (kj::_::Debug::minSeverity < 3 && local_33c[3] == 0) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3be,ERROR,"\"failed: expected \" \"resolved1\"",
                 (char (*) [27])"failed: expected resolved1");
    }
    if (kj::_::Debug::minSeverity < 3 && local_33c[2] == 0) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3bf,ERROR,"\"failed: expected \" \"resolved2\"",
                 (char (*) [27])"failed: expected resolved2");
    }
    if ((local_33c[1] == '\0') && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3c0,ERROR,"\"failed: expected \" \"resolved3\"",
                 (char (*) [27])"failed: expected resolved3");
    }
    pPVar1 = local_130.ptr;
    if ((TransformPromiseNodeBase *)local_130.ptr != (TransformPromiseNodeBase *)0x0) {
      local_130.ptr = (PromiseNode *)0x0;
      (**(local_130.disposer)->_vptr_Disposer)
                (local_130.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    }
    pPVar1 = local_120.ptr;
    if ((TransformPromiseNodeBase *)local_120.ptr != (TransformPromiseNodeBase *)0x0) {
      local_120.ptr = (PromiseNode *)0x0;
      (**(local_120.disposer)->_vptr_Disposer)
                (local_120.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    }
    pPVar1 = local_318.ptr;
    if ((TransformPromiseNodeBase *)local_318.ptr != (TransformPromiseNodeBase *)0x0) {
      local_318.ptr = (PromiseNode *)0x0;
      (**(local_318.disposer)->_vptr_Disposer)
                (local_318.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    }
    plVar2 = local_c8;
    if (local_c8 != (long *)0x0) {
      local_c8 = (long *)0x0;
      (**(code **)*local_d0)(local_d0,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = local_2c0;
    if (local_2c0 != (long *)0x0) {
      local_2c0 = (long *)0x0;
      (**(code **)*local_2c8)(local_2c8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pPVar1 = local_2d8.super_PromiseBase.node.ptr;
    if ((Server *)local_2d8.super_PromiseBase.node.ptr != (Server *)0x0) {
      local_2d8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_2d8.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_2d8.super_PromiseBase.node.disposer,
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    }
    plVar2 = local_2a0;
    if (local_2a0 != (long *)0x0) {
      local_2a0 = (long *)0x0;
      (**(code **)*local_2a8)(local_2a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = local_2e8;
    if (local_2e8 != (long *)0x0) {
      local_2e8 = (long *)0x0;
      (**(code **)*local_2f0)(local_2f0,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = local_2f8;
    if (local_2f8 != (long *)0x0) {
      local_2f8 = (long *)0x0;
      (**(_func_int **)((local_300.exception)->ownFile).content.ptr)
                (local_300.exception,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = local_b0;
    if (local_b0 != (long *)0x0) {
      local_b0 = (long *)0x0;
      (*(code *)**(undefined8 **)local_c0._8_8_)
                (local_c0._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pEVar5 = local_108;
    if (local_108 != (Exception *)0x0) {
      local_108 = (Exception *)0x0;
      (**local_110->_vptr_Disposer)(local_110,(long)pEVar5 + *(long *)(*(long *)pEVar5 + -0x10));
    }
    plVar2 = local_e0;
    if (local_e0 != (long *)0x0) {
      local_e0 = (long *)0x0;
      (**(code **)*local_e8)(local_e8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pEVar5 = local_f8;
    if (local_f8 != (Exception *)0x0) {
      local_f8 = (Exception *)0x0;
      (**local_100->_vptr_Disposer)(local_100,(long)pEVar5 + *(long *)(*(long *)pEVar5 + -0x10));
    }
    pCVar6 = local_a0.hook.ptr;
    if (local_a0.hook.ptr != (ClientHook *)0x0) {
      local_a0.hook.ptr = (ClientHook *)0x0;
      (**(local_a0.hook.disposer)->_vptr_Disposer)
                (local_a0.hook.disposer,
                 pCVar6->_vptr_ClientHook[-2] + (long)&pCVar6->_vptr_ClientHook);
    }
    pCVar6 = local_88.hook.ptr;
    if (local_88.hook.ptr != (ClientHook *)0x0) {
      local_88.hook.ptr = (ClientHook *)0x0;
      (**(local_88.hook.disposer)->_vptr_Disposer)
                (local_88.hook.disposer,
                 pCVar6->_vptr_ClientHook[-2] + (long)&pCVar6->_vptr_ClientHook);
    }
    kj::EventLoop::leaveScope(local_328.loop);
    kj::EventLoop::~EventLoop(&local_60);
    return;
  }
  local_300.exception = (Exception *)0x0;
  local_298.exception.ptr._0_8_ = (Disposer *)0x0;
  local_298.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
  kj::_::Debug::Fault::init
            (&local_300,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
            );
  kj::_::Debug::Fault::fatal(&local_300);
}

Assistant:

TEST(Capability, CapabilityServerSet) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  CapabilityServerSet<test::TestInterface> set1, set2;

  int callCount = 0;
  test::TestInterface::Client clientStandalone(kj::heap<TestInterfaceImpl>(callCount));
  test::TestInterface::Client clientNull = nullptr;

  auto ownServer1 = kj::heap<TestInterfaceImpl>(callCount);
  auto& server1 = *ownServer1;
  test::TestInterface::Client client1 = set1.add(kj::mv(ownServer1));

  auto ownServer2 = kj::heap<TestInterfaceImpl>(callCount);
  auto& server2 = *ownServer2;
  test::TestInterface::Client client2 = set2.add(kj::mv(ownServer2));

  // Getting the local server using the correct set works.
  EXPECT_EQ(&server1, &KJ_ASSERT_NONNULL(set1.getLocalServer(client1).wait(waitScope)));
  EXPECT_EQ(&server2, &KJ_ASSERT_NONNULL(set2.getLocalServer(client2).wait(waitScope)));

  // Getting the local server using the wrong set doesn't work.
  EXPECT_TRUE(set1.getLocalServer(client2).wait(waitScope) == nullptr);
  EXPECT_TRUE(set2.getLocalServer(client1).wait(waitScope) == nullptr);
  EXPECT_TRUE(set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr);
  EXPECT_TRUE(set1.getLocalServer(clientNull).wait(waitScope) == nullptr);

  // A promise client waits to be resolved.
  auto paf = kj::newPromiseAndFulfiller<test::TestInterface::Client>();
  test::TestInterface::Client clientPromise = kj::mv(paf.promise);

  auto errorPaf = kj::newPromiseAndFulfiller<test::TestInterface::Client>();
  test::TestInterface::Client errorPromise = kj::mv(errorPaf.promise);

  bool resolved1 = false, resolved2 = false, resolved3 = false;
  auto promise1 = set1.getLocalServer(clientPromise)
      .then([&](kj::Maybe<test::TestInterface::Server&> server) {
    resolved1 = true;
    EXPECT_EQ(&server1, &KJ_ASSERT_NONNULL(server));
  });
  auto promise2 = set2.getLocalServer(clientPromise)
      .then([&](kj::Maybe<test::TestInterface::Server&> server) {
    resolved2 = true;
    EXPECT_TRUE(server == nullptr);
  });
  auto promise3 = set1.getLocalServer(errorPromise)
      .then([&](kj::Maybe<test::TestInterface::Server&> server) {
    KJ_FAIL_EXPECT("getLocalServer() on error promise should have thrown");
  }, [&](kj::Exception&& e) {
    resolved3 = true;
    KJ_EXPECT(e.getDescription().endsWith("foo"), e.getDescription());
  });

  kj::evalLater([](){}).wait(waitScope);
  kj::evalLater([](){}).wait(waitScope);
  kj::evalLater([](){}).wait(waitScope);
  kj::evalLater([](){}).wait(waitScope);

  EXPECT_FALSE(resolved1);
  EXPECT_FALSE(resolved2);
  EXPECT_FALSE(resolved3);

  paf.fulfiller->fulfill(kj::cp(client1));
  errorPaf.fulfiller->reject(KJ_EXCEPTION(FAILED, "foo"));

  promise1.wait(waitScope);
  promise2.wait(waitScope);
  promise3.wait(waitScope);

  EXPECT_TRUE(resolved1);
  EXPECT_TRUE(resolved2);
  EXPECT_TRUE(resolved3);
}